

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::InvalidateAllPropertyGuards(ThreadContext *this)

{
  int iVar1;
  RecyclableData *pRVar2;
  Type *this_00;
  PropertyGuardDictionary *guards;
  ThreadContext *this_local;
  
  pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  this_00 = &pRVar2->propertyGuards;
  iVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
          ::Count(this_00);
  if (0 < iVar1) {
    JsUtil::
    WeaklyReferencedKeyDictionary<Js::PropertyRecord_const,ThreadContext::PropertyGuardEntry*,Js::PropertyRecordPointerComparer,true>
    ::Map<ThreadContext::InvalidateAllPropertyGuards()::__0>
              ((WeaklyReferencedKeyDictionary<Js::PropertyRecord_const,ThreadContext::PropertyGuardEntry*,Js::PropertyRecordPointerComparer,true>
                *)this_00,(anon_class_8_1_8991fb9c)this);
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::Clear(this_00);
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateAllPropertyGuards()
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    if (guards.Count() > 0)
    {
        guards.Map([this](Js::PropertyRecord const * propertyRecord, PropertyGuardEntry* entry, const RecyclerWeakReference<const Js::PropertyRecord>* weakRef)
        {
            InvalidatePropertyGuardEntry(propertyRecord, entry, true);
        });

        guards.Clear();
    }
}